

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_writeValueInfo
                 (qpTestLog *log,char *name,char *description,char *unit,qpSampleValueTag tag)

{
  char *pcVar1;
  deBool dVar2;
  int numAttribs;
  deBool dVar3;
  qpXmlAttribute attribs [4];
  qpXmlAttribute local_b8;
  char *local_98;
  undefined4 local_90;
  char *local_88;
  undefined8 local_80;
  char *local_78;
  undefined4 local_70;
  char *local_68;
  undefined8 local_60;
  char *local_58;
  undefined4 local_50;
  char *local_48;
  undefined8 local_40;
  
  pcVar1 = s_qpSampleValueTagMap[(int)tag].string;
  deMutex_lock(log->lock);
  local_b8.name = "Name";
  local_b8.type = QP_XML_ATTRIBUTE_STRING;
  local_b8.intValue = -0x2a6;
  local_b8.boolValue = -1;
  local_98 = "Description";
  local_90 = 0;
  local_80 = 0xfffffffffffffd5a;
  local_78 = "Tag";
  local_70 = 0;
  local_60 = 0xfffffffffffffd5a;
  if (unit == (char *)0x0) {
    numAttribs = 3;
  }
  else {
    local_58 = "Unit";
    local_50 = 0;
    local_40 = 0xfffffffffffffd5a;
    numAttribs = 4;
    local_48 = unit;
  }
  local_b8.stringValue = name;
  local_88 = description;
  local_68 = pcVar1;
  dVar2 = qpXmlWriter_startElement(log->writer,"ValueInfo",numAttribs,&local_b8);
  if (dVar2 != 0) {
    dVar2 = qpXmlWriter_endElement(log->writer,"ValueInfo");
    dVar3 = 1;
    if (dVar2 != 0) goto LAB_00211d47;
  }
  dVar3 = 0;
  qpPrintf("qpTestLog_writeValueInfo(): Writing XML failed\n");
LAB_00211d47:
  deMutex_unlock(log->lock);
  return dVar3;
}

Assistant:

deBool qpTestLog_writeValueInfo (qpTestLog* log, const char* name, const char* description, const char* unit, qpSampleValueTag tag)
{
	const char*		tagName		= QP_LOOKUP_STRING(s_qpSampleValueTagMap, tag);
	int				numAttribs	= 0;
	qpXmlAttribute	attribs[4];

	DE_ASSERT(log && name && description && tagName);
	deMutex_lock(log->lock);

	DE_ASSERT(ContainerStack_getTop(&log->containerStack) == CONTAINERTYPE_SAMPLEINFO);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Description", description);
	attribs[numAttribs++] = qpSetStringAttrib("Tag", tagName);

	if (unit)
		attribs[numAttribs++] = qpSetStringAttrib("Unit", unit);

	if (!qpXmlWriter_startElement(log->writer, "ValueInfo", numAttribs, attribs) ||
		!qpXmlWriter_endElement(log->writer, "ValueInfo"))
	{
		qpPrintf("qpTestLog_writeValueInfo(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}